

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

bool __thiscall
testing::internal::DefaultDeathTestFactory::Create
          (DefaultDeathTestFactory *this,char *statement,RE *regex,char *file,int line,
          DeathTest **test)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  InternalRunDeathTestFlag *rhs;
  bool bVar4;
  DeathTest *this_00;
  String local_58;
  _func_int **local_40;
  RE *local_38;
  
  local_40 = (_func_int **)statement;
  UnitTest::GetInstance();
  rhs = ((UnitTest::GetInstance::instance.impl_)->internal_run_death_test_flag_).ptr_;
  iVar2 = ((UnitTest::GetInstance::instance.impl_)->current_test_info_->result_).death_test_count_;
  uVar1 = iVar2 + 1;
  ((UnitTest::GetInstance::instance.impl_)->current_test_info_->result_).death_test_count_ = uVar1;
  if (rhs == (InternalRunDeathTestFlag *)0x0) {
LAB_0011d9b5:
    bVar4 = String::operator==((String *)&FLAGS_gtest_death_test_style,"threadsafe");
    if (bVar4) {
      this_00 = (DeathTest *)operator_new(0x40);
      DeathTest::DeathTest(this_00);
      this_00[1]._vptr_DeathTest = local_40;
      this_00[2]._vptr_DeathTest = (_func_int **)regex;
      *(undefined1 *)&this_00[3]._vptr_DeathTest = 0;
      *(undefined8 *)((long)&this_00[3]._vptr_DeathTest + 4) = 0xffffffff;
      *(undefined8 *)((long)&this_00[4]._vptr_DeathTest + 4) = 0xffffffffffffffff;
      *(undefined4 *)((long)&this_00[5]._vptr_DeathTest + 4) = 0xffffffff;
      this_00->_vptr_DeathTest = (_func_int **)&PTR__DeathTestImpl_00139b08;
      this_00[6]._vptr_DeathTest = (_func_int **)file;
      *(int *)&this_00[7]._vptr_DeathTest = line;
    }
    else {
      bVar4 = String::operator==((String *)&FLAGS_gtest_death_test_style,"fast");
      if (!bVar4) {
        String::Format((char *)&local_58,"Unknown death test style \"%s\" encountered",
                       FLAGS_gtest_death_test_style);
        String::operator=((String *)&DeathTest::last_death_test_message_,&local_58);
LAB_0011daf6:
        if (local_58.c_str_ != (char *)0x0) {
          operator_delete__(local_58.c_str_);
        }
        return false;
      }
      this_00 = (DeathTest *)operator_new(0x30);
      DeathTest::DeathTest(this_00);
      this_00[1]._vptr_DeathTest = local_40;
      this_00[2]._vptr_DeathTest = (_func_int **)regex;
      *(undefined1 *)&this_00[3]._vptr_DeathTest = 0;
      *(undefined8 *)((long)&this_00[3]._vptr_DeathTest + 4) = 0xffffffff;
      *(undefined8 *)((long)&this_00[4]._vptr_DeathTest + 4) = 0xffffffffffffffff;
      *(undefined4 *)((long)&this_00[5]._vptr_DeathTest + 4) = 0xffffffff;
      this_00->_vptr_DeathTest = (_func_int **)&PTR__DeathTestImpl_00139ab0;
    }
    *test = this_00;
  }
  else {
    if (rhs->index_ <= iVar2) {
      String::Format((char *)&local_58,
                     "Death test count (%d) somehow exceeded expected maximum (%d)",(ulong)uVar1);
      String::operator=((String *)&DeathTest::last_death_test_message_,&local_58);
      goto LAB_0011daf6;
    }
    local_58.c_str_ = (char *)0x0;
    local_58.length_ = 0;
    local_38 = regex;
    String::operator=(&local_58,&rhs->file_);
    bVar4 = String::operator==(&local_58,file);
    if ((bVar4) && (rhs->line_ == line)) {
      uVar3 = rhs->index_;
      if (local_58.c_str_ != (char *)0x0) {
        operator_delete__(local_58.c_str_);
      }
      regex = local_38;
      if (uVar3 == uVar1) goto LAB_0011d9b5;
    }
    else if (local_58.c_str_ != (char *)0x0) {
      operator_delete__(local_58.c_str_);
    }
    *test = (DeathTest *)0x0;
  }
  return true;
}

Assistant:

bool DefaultDeathTestFactory::Create(const char* statement, const RE* regex,
                                     const char* file, int line,
                                     DeathTest** test) {
  UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const int death_test_index = impl->current_test_info()
      ->increment_death_test_count();

  if (flag != NULL) {
    if (death_test_index > flag->index()) {
      DeathTest::set_last_death_test_message(String::Format(
          "Death test count (%d) somehow exceeded expected maximum (%d)",
          death_test_index, flag->index()));
      return false;
    }

    if (!(flag->file() == file && flag->line() == line &&
          flag->index() == death_test_index)) {
      *test = NULL;
      return true;
    }
  }

# if GTEST_OS_WINDOWS

  if (GTEST_FLAG(death_test_style) == "threadsafe" ||
      GTEST_FLAG(death_test_style) == "fast") {
    *test = new WindowsDeathTest(statement, regex, file, line);
  }

# else

  if (GTEST_FLAG(death_test_style) == "threadsafe") {
    *test = new ExecDeathTest(statement, regex, file, line);
  } else if (GTEST_FLAG(death_test_style) == "fast") {
    *test = new NoExecDeathTest(statement, regex);
  }

# endif  // GTEST_OS_WINDOWS

  else {  // NOLINT - this is more readable than unbalanced brackets inside #if.
    DeathTest::set_last_death_test_message(String::Format(
        "Unknown death test style \"%s\" encountered",
        GTEST_FLAG(death_test_style).c_str()));
    return false;
  }